

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_and_glx_different_pointers.c
# Opt level: O0

void init_egl(EGLDisplay *out_dpy,EGLContext *out_ctx)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_34 [4];
  undefined8 uStack_30;
  EGLint count;
  EGLConfig cfg;
  EGLContext ctx;
  EGLDisplay dpy;
  EGLContext *out_ctx_local;
  EGLDisplay *out_dpy_local;
  
  dpy = out_ctx;
  out_ctx_local = out_dpy;
  ctx = get_egl_display_or_skip();
  uVar2 = epoxy_has_egl_extension(ctx,"EGL_KHR_surfaceless_context");
  if ((uVar2 & 1) == 0) {
    errx(0x4d,"Test requires EGL_KHR_surfaceless_context");
  }
  (*_epoxy_eglBindAPI)(0x30a0);
  iVar1 = (*_epoxy_eglChooseConfig)
                    (ctx,init_egl::config_attribs,&stack0xffffffffffffffd0,1,local_34);
  if (iVar1 == 0) {
    errx(0x4d,"Couldn\'t get an EGLConfig\n");
  }
  cfg = (EGLConfig)(*_epoxy_eglCreateContext)(ctx,uStack_30,0,init_egl::context_attribs);
  if (cfg == (EGLConfig)0x0) {
    errx(0x4d,"Couldn\'t create a GLES2 context\n");
  }
  *out_ctx_local = ctx;
  *(EGLConfig *)dpy = cfg;
  return;
}

Assistant:

static void
init_egl(EGLDisplay *out_dpy, EGLContext *out_ctx)
{
    EGLDisplay dpy = get_egl_display_or_skip();
    static const EGLint config_attribs[] = {
	EGL_SURFACE_TYPE, EGL_WINDOW_BIT,
	EGL_RED_SIZE, 1,
	EGL_GREEN_SIZE, 1,
	EGL_BLUE_SIZE, 1,
	EGL_RENDERABLE_TYPE, EGL_OPENGL_ES2_BIT,
	EGL_NONE
    };
    static const EGLint context_attribs[] = {
        EGL_CONTEXT_CLIENT_VERSION, 2,
        EGL_NONE
    };
    EGLContext ctx;
    EGLConfig cfg;
    EGLint count;

    if (!epoxy_has_egl_extension(dpy, "EGL_KHR_surfaceless_context"))
        errx(77, "Test requires EGL_KHR_surfaceless_context");

    eglBindAPI(EGL_OPENGL_ES_API);

    if (!eglChooseConfig(dpy, config_attribs, &cfg, 1, &count))
        errx(77, "Couldn't get an EGLConfig\n");

    ctx = eglCreateContext(dpy, cfg, NULL, context_attribs);
    if (!ctx)
        errx(77, "Couldn't create a GLES2 context\n");

    *out_dpy = dpy;
    *out_ctx = ctx;
}